

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O2

void Nwk_ManGraphVertexRemoveEdge(Nwk_Vrt_t *pThis,Nwk_Vrt_t *pNext)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = pThis->nEdges;
  uVar2 = 0;
  uVar3 = 0;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  while( true ) {
    if (uVar3 == uVar2) {
      __assert_fail("k < pThis->nEdges",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkMerge.c"
                    ,0x1bb,"void Nwk_ManGraphVertexRemoveEdge(Nwk_Vrt_t *, Nwk_Vrt_t *)");
    }
    if ((&pThis[1].Id)[uVar2] == pNext->Id) break;
    uVar2 = uVar2 + 1;
  }
  uVar1 = uVar1 - 1;
  pThis->nEdges = uVar1;
  uVar3 = (ulong)uVar1;
  if ((int)uVar1 < (int)uVar2) {
    uVar3 = uVar2 & 0xffffffff;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    (&pThis[1].Id)[uVar2] = (&pThis[1].iPrev)[uVar2];
  }
  return;
}

Assistant:

static inline void Nwk_ManGraphVertexRemoveEdge( Nwk_Vrt_t * pThis, Nwk_Vrt_t * pNext )
{
    int k;
    for ( k = 0; k < pThis->nEdges; k++ )
        if ( pThis->pEdges[k] == pNext->Id )
            break;
    assert( k < pThis->nEdges );
    pThis->nEdges--;
    for ( ; k < pThis->nEdges; k++ )
        pThis->pEdges[k] = pThis->pEdges[k+1];
}